

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::ProcessCacheArg(cmake *this,string *var,string *value,CacheEntryType type)

{
  bool bVar1;
  cmValue cVar2;
  string *__rhs;
  string cachedValue;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (this->WarnUnusedCli == true) {
    cVar2 = cmState::GetInitializedCacheValue
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,var);
    if (cVar2.Value == (string *)0x0) goto LAB_001aaf11;
    bVar1 = true;
    std::__cxx11::string::_M_assign((string *)&local_68);
  }
  else {
LAB_001aaf11:
    bVar1 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"No help, variable specified on the command line.",&local_69);
  AddCacheEntry(this,var,(cmValue)value,(string *)local_48,type);
  std::__cxx11::string::~string(local_48);
  if (this->WarnUnusedCli == true) {
    if (bVar1) {
      __rhs = (string *)
              cmState::GetInitializedCacheValue
                        ((this->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,var);
      if (__rhs == (string *)0x0) {
        __rhs = &cmValue::Empty_abi_cxx11_;
      }
      bVar1 = std::operator!=(&local_68,__rhs);
      if (!bVar1) goto LAB_001aaf90;
    }
    WatchUnusedCli(this,var);
  }
LAB_001aaf90:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmake::ProcessCacheArg(const std::string& var, const std::string& value,
                            cmStateEnums::CacheEntryType type)
{
  // The value is transformed if it is a filepath for example, so
  // we can't compare whether the value is already in the cache until
  // after we call AddCacheEntry.
  bool haveValue = false;
  std::string cachedValue;
  if (this->WarnUnusedCli) {
    if (cmValue v = this->State->GetInitializedCacheValue(var)) {
      haveValue = true;
      cachedValue = *v;
    }
  }

  this->AddCacheEntry(
    var, value, "No help, variable specified on the command line.", type);

  if (this->WarnUnusedCli) {
    if (!haveValue ||
        cachedValue != *this->State->GetInitializedCacheValue(var)) {
      this->WatchUnusedCli(var);
    }
  }
}